

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawPlane
          (cbtIDebugDraw *this,cbtVector3 *planeNormal,cbtScalar planeConst,cbtTransform *transform,
          cbtVector3 *color)

{
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [16];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  cbtVector3 cVar16;
  cbtVector3 pt3;
  cbtVector3 pt2;
  cbtVector3 pt1;
  cbtVector3 pt0;
  cbtVector3 vec1;
  cbtVector3 vec0;
  cbtScalar local_dc;
  undefined8 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  cbtVector3 local_90;
  cbtVector3 local_80;
  cbtVector3 local_70;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  auVar6 = in_register_00001204._4_56_;
  local_dc = planeConst;
  cVar16 = ::operator*(planeNormal,&local_dc);
  local_d8 = cVar16.m_floats._8_8_;
  auVar1._0_8_ = cVar16.m_floats._0_8_;
  auVar1._8_56_ = auVar6;
  local_c8 = auVar1._0_16_;
  cbtPlaneSpace1<cbtVector3>(planeNormal,&local_40,&local_50);
  auVar13._0_4_ = local_40.m_floats[0] * 100.0;
  auVar13._4_4_ = local_40.m_floats[1] * 100.0;
  auVar13._8_8_ = 0;
  auVar15._0_4_ = local_c8._0_4_ + auVar13._0_4_;
  auVar15._4_4_ = local_c8._4_4_ + auVar13._4_4_;
  auVar15._8_4_ = local_c8._8_4_ + 0.0;
  auVar15._12_4_ = local_c8._12_4_ + 0.0;
  auVar7 = vsubps_avx(local_c8,auVar13);
  local_70.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar7,ZEXT416((uint)((float)local_d8 - local_40.m_floats[2] * 100.0)),0x28);
  local_60.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar15,ZEXT416((uint)((float)local_d8 + local_40.m_floats[2] * 100.0)),0x28);
  auVar7._0_4_ = local_50.m_floats[0] * 100.0;
  auVar7._4_4_ = local_50.m_floats[1] * 100.0;
  auVar7._8_8_ = 0;
  auVar14._0_4_ = local_c8._0_4_ + auVar7._0_4_;
  auVar14._4_4_ = local_c8._4_4_ + auVar7._4_4_;
  auVar14._8_4_ = local_c8._8_4_ + 0.0;
  auVar14._12_4_ = local_c8._12_4_ + 0.0;
  auVar7 = vsubps_avx(local_c8,auVar7);
  auVar12 = ZEXT856(auVar7._8_8_);
  local_80.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar14,ZEXT416((uint)((float)local_d8 + local_50.m_floats[2] * 100.0)),0x28);
  local_90.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar7,ZEXT416((uint)((float)local_d8 - local_50.m_floats[2] * 100.0)),0x28);
  auVar6 = ZEXT856(local_90.m_floats._8_8_);
  cVar16 = cbtTransform::operator()(transform,&local_60);
  auVar8._0_8_ = cVar16.m_floats._8_8_;
  auVar8._8_56_ = auVar12;
  auVar2._0_8_ = cVar16.m_floats._0_8_;
  auVar2._8_56_ = auVar6;
  local_a0 = vmovlhps_avx(auVar2._0_16_,auVar8._0_16_);
  auVar6 = ZEXT856(local_a0._8_8_);
  cVar16 = cbtTransform::operator()(transform,&local_70);
  auVar9._0_8_ = cVar16.m_floats._8_8_;
  auVar9._8_56_ = auVar12;
  auVar3._0_8_ = cVar16.m_floats._0_8_;
  auVar3._8_56_ = auVar6;
  local_b0 = vmovlhps_avx(auVar3._0_16_,auVar9._0_16_);
  auVar6 = ZEXT856(local_b0._8_8_);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_a0,local_b0,color);
  cVar16 = cbtTransform::operator()(transform,&local_80);
  auVar10._0_8_ = cVar16.m_floats._8_8_;
  auVar10._8_56_ = auVar12;
  auVar4._0_8_ = cVar16.m_floats._0_8_;
  auVar4._8_56_ = auVar6;
  local_a0 = vmovlhps_avx(auVar4._0_16_,auVar10._0_16_);
  auVar6 = ZEXT856(local_a0._8_8_);
  cVar16 = cbtTransform::operator()(transform,&local_90);
  auVar11._0_8_ = cVar16.m_floats._8_8_;
  auVar11._8_56_ = auVar12;
  auVar5._0_8_ = cVar16.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  local_b0 = vmovlhps_avx(auVar5._0_16_,auVar11._0_16_);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_a0,local_b0,color);
  return;
}

Assistant:

virtual void drawPlane(const cbtVector3& planeNormal, cbtScalar planeConst, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 planeOrigin = planeNormal * planeConst;
		cbtVector3 vec0, vec1;
		cbtPlaneSpace1(planeNormal, vec0, vec1);
		cbtScalar vecLen = 100.f;
		cbtVector3 pt0 = planeOrigin + vec0 * vecLen;
		cbtVector3 pt1 = planeOrigin - vec0 * vecLen;
		cbtVector3 pt2 = planeOrigin + vec1 * vecLen;
		cbtVector3 pt3 = planeOrigin - vec1 * vecLen;
		drawLine(transform * pt0, transform * pt1, color);
		drawLine(transform * pt2, transform * pt3, color);
	}